

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

optional<cmLinkItem> * __thiscall
cmGeneratorTarget::LookupLinkItem
          (optional<cmLinkItem> *__return_storage_ptr__,cmGeneratorTarget *this,string *n,
          cmListFileBacktrace *bt,string *linkFeature,LookupLinkItemScope *scope,
          LookupSelf lookupSelf)

{
  bool bVar1;
  __type _Var2;
  string *__rhs;
  string name;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  _Stack_118;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_c8;
  cmLinkItem local_98;
  
  (__return_storage_ptr__->super__Optional_base<cmLinkItem,_false,_false>)._M_payload.
  super__Optional_payload<cmLinkItem,_true,_false,_false>.super__Optional_payload_base<cmLinkItem>.
  _M_engaged = false;
  bVar1 = IsLinkLookupScope(this,n,&scope->LG);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  CheckCMP0004(&local_108,this,n);
  if (local_108._M_string_length != 0) {
    if (lookupSelf == No) {
      __rhs = GetName_abi_cxx11_(this);
      _Var2 = std::operator==(&local_108,__rhs);
      if (_Var2) goto LAB_0049b931;
    }
    std::__cxx11::string::string((string *)&local_e8,(string *)&local_108);
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&_Stack_118,
                   (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    *)bt);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_c8,&local_e8,(cmListFileBacktrace *)&_Stack_118);
    ResolveLinkItem(&local_98,this,&local_c8,scope->LG,linkFeature);
    std::optional<cmLinkItem>::operator=(__return_storage_ptr__,&local_98);
    cmLinkItem::~cmLinkItem(&local_98);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_118._M_refcount);
    std::__cxx11::string::~string((string *)&local_e8);
  }
LAB_0049b931:
  std::__cxx11::string::~string((string *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

cm::optional<cmLinkItem> cmGeneratorTarget::LookupLinkItem(
  std::string const& n, cmListFileBacktrace const& bt,
  std::string const& linkFeature, LookupLinkItemScope* scope,
  LookupSelf lookupSelf) const
{
  cm::optional<cmLinkItem> maybeItem;
  if (this->IsLinkLookupScope(n, scope->LG)) {
    return maybeItem;
  }

  std::string name = this->CheckCMP0004(n);
  if (name.empty() ||
      (lookupSelf == LookupSelf::No && name == this->GetName())) {
    return maybeItem;
  }
  maybeItem =
    this->ResolveLinkItem(BT<std::string>(name, bt), scope->LG, linkFeature);
  return maybeItem;
}